

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs_queue.c
# Opt level: O0

job_t * create_job(void)

{
  http_request_old_t *phVar1;
  raw_client_data_t *prVar2;
  http_response_old_t *phVar3;
  job_t *j;
  
  j = (job_t *)malloc(0x18);
  if (j == (job_t *)0x0) {
    j = (job_t *)0x0;
  }
  else {
    phVar1 = create_request();
    j->req = phVar1;
    if (phVar1 == (http_request_old_t *)0x0) {
      j = (job_t *)0x0;
    }
    else {
      prVar2 = create_raw_data();
      j->raw_data = prVar2;
      if (prVar2 == (raw_client_data_t *)0x0) {
        j = (job_t *)0x0;
      }
      else {
        phVar3 = create_http_response();
        j->response = phVar3;
        if (phVar3 == (http_response_old_t *)0x0) {
          j = (job_t *)0x0;
        }
      }
    }
  }
  return j;
}

Assistant:

job_t* create_job()
{
  job_t* j;

  if((j =(job_t*)malloc(sizeof(job_t))) == NULL)
    return NULL;
  if((j->req = create_request()) == NULL)
    return NULL;
  if((j->raw_data = create_raw_data()) == NULL)
    return NULL;
  if((j->response = create_http_response()) == NULL)
    return NULL;
  return j;

}